

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

bool __thiscall wabt::SharedValidator::ValidInitOpcode(SharedValidator *this,Opcode opcode)

{
  bool bVar1;
  Enum EVar2;
  SharedValidator *this_local;
  Opcode opcode_local;
  
  this_local._0_4_ = opcode.enum_;
  EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local);
  if ((((EVar2 == GlobalGet) ||
       (EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == I32Const)) ||
      (EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == I64Const)) ||
     (((EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == F32Const ||
       (EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == F64Const)) ||
      ((EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == RefFunc ||
       (EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == RefNull)))))) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = Features::extended_const_enabled((Features *)this);
    if ((bVar1) &&
       (((EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == I32Mul ||
         (EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == I64Mul)) ||
        ((EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == I32Sub ||
         (((EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == I64Sub ||
           (EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == I32Add)) ||
          (EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 == I64Add)))))))) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SharedValidator::ValidInitOpcode(Opcode opcode) const {
  if (opcode == Opcode::GlobalGet || opcode == Opcode::I32Const ||
      opcode == Opcode::I64Const || opcode == Opcode::F32Const ||
      opcode == Opcode::F64Const || opcode == Opcode::RefFunc ||
      opcode == Opcode::RefNull) {
    return true;
  }
  if (options_.features.extended_const_enabled()) {
    if (opcode == Opcode::I32Mul || opcode == Opcode::I64Mul ||
        opcode == Opcode::I32Sub || opcode == Opcode::I64Sub ||
        opcode == Opcode::I32Add || opcode == Opcode::I64Add) {
      return true;
    }
  }
  return false;
}